

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *multipart_header,ContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  bool bVar2;
  string boundary;
  ContentReceiverWithProgress out;
  MultipartFormDataParser multipart_form_data_parser;
  string local_270;
  string local_250;
  Stream *local_230;
  _Any_data local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  _Any_data local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_1e8;
  anon_class_24_3_0ed7a2d1 local_1c8;
  MultipartFormDataParser local_1b0;
  
  local_230 = strm;
  detail::MultipartFormDataParser::MultipartFormDataParser(&local_1b0);
  local_218 = 0;
  uStack_210 = 0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_250,"Content-Type",(allocator *)&local_1c8);
    Request::get_header_value(&local_270,req,&local_250,0);
    std::__cxx11::string::~string((string *)&local_250);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    bVar1 = detail::parse_multipart_boundary(&local_270,&local_250);
    if (bVar1) {
      detail::MultipartFormDataParser::set_boundary(&local_1b0,&local_250);
      local_1c8.multipart_receiver = multipart_receiver;
      local_1c8.multipart_form_data_parser = &local_1b0;
      local_1c8.multipart_header = multipart_header;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                 local_228._M_pod_data,&local_1c8);
    }
    else {
      res->status = 400;
    }
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    if (bVar1) goto LAB_00146bb8;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_270,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
               local_228._M_pod_data,(anon_class_32_1_b7b80f6d *)&local_270);
    std::_Function_base::~_Function_base((_Function_base *)&local_270);
LAB_00146bb8:
    bVar1 = std::operator==(&req->method,"DELETE");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_270,"Content-Length",(allocator *)&local_250);
      bVar1 = detail::has_header(&req->headers,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      bVar2 = true;
      if (!bVar1) goto LAB_00146c99;
    }
    payload_max_length = this->payload_max_length_;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_208._M_unused._M_object = (void *)0x0;
    local_208._8_8_ = 0;
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              (&local_1e8,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_228);
    bVar1 = detail::read_content<httplib::Request>
                      (local_230,req,payload_max_length,&res->status,(Progress *)&local_208,
                       &local_1e8,true);
    std::_Function_base::~_Function_base(&local_1e8.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)&local_208);
    if (bVar1) {
      bVar1 = Request::is_multipart_form_data(req);
      bVar2 = true;
      if ((!bVar1) || (local_1b0.is_valid_ != false)) goto LAB_00146c99;
      res->status = 400;
    }
  }
  bVar2 = false;
LAB_00146c99:
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  detail::MultipartFormDataParser::~MultipartFormDataParser(&local_1b0);
  return bVar2;
}

Assistant:

inline bool Server::read_content_core(Stream &strm, Request &req, Response &res,
                                      ContentReceiver receiver,
                                      MultipartContentHeader multipart_header,
                                      ContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiverWithProgress out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return false;
    }

    multipart_form_data_parser.set_boundary(std::move(boundary));
    out = [&](const char *buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
      /* For debug
      size_t pos = 0;
      while (pos < n) {
        auto read_size = (std::min)<size_t>(1, n - pos);
        auto ret = multipart_form_data_parser.parse(
            buf + pos, read_size, multipart_receiver, multipart_header);
        if (!ret) { return false; }
        pos += read_size;
      }
      return true;
      */
      return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                                              multipart_header);
    };
  } else {
    out = [receiver](const char *buf, size_t n, uint64_t /*off*/,
                     uint64_t /*len*/) { return receiver(buf, n); };
  }

  if (req.method == "DELETE" && !req.has_header("Content-Length")) {
    return true;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
                            out, true)) {
    return false;
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return false;
    }
  }

  return true;
}